

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  uint64_t *puVar1;
  st_ptls_aead_context_t *psVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  int iVar5;
  int iVar6;
  st_ptls_aead_algorithm_t *psVar7;
  uint8_t *end;
  ulong uVar8;
  size_t sVar9;
  uint8_t *puVar10;
  size_t consumed;
  size_t local_88;
  uint64_t nonce;
  uint8_t *src;
  size_t *local_70;
  ptls_buffer_t *local_68;
  size_t local_60;
  uint8_t local_55 [13];
  st_ptls_record_t rec;
  
  if (tls->state < PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x17c7,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
  }
  puVar10 = (uint8_t *)(*inlen + (long)_input);
  sVar9 = decryptbuf->off;
  local_68 = &(tls->recvbuf).rec;
  iVar5 = 0;
  local_70 = inlen;
  local_60 = sVar9;
  do {
    if (((iVar5 != 0) || ((uint8_t *)_input == puVar10)) || (sVar9 != decryptbuf->off)) {
      *local_70 = (size_t)((long)_input + (*local_70 - (long)puVar10));
      return iVar5;
    }
    consumed = (long)puVar10 - (long)_input;
    if (((tls->traffic_protection).dec.field_0x58 & 1) == 0) {
      iVar5 = handle_input(tls,(ptls_message_emitter_t *)0x0,decryptbuf,_input,&consumed,
                           (ptls_handshake_properties_t *)0x0);
    }
    else {
      iVar5 = parse_record(tls,&rec,(uint8_t *)_input,&consumed);
      if (iVar5 == 0) {
        if (rec.fragment == (uint8_t *)0x0) {
          __assert_fail("rec.fragment != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x1743,
                        "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)")
          ;
        }
        src = rec.fragment;
        end = rec.fragment + rec.length;
        psVar7 = ((tls->traffic_protection).dec.aead)->algo;
        sVar9 = (psVar7->tls12).record_iv_size;
        if (sVar9 == 0) {
          nonce = (tls->traffic_protection).dec.seq;
LAB_00112180:
          uVar4 = rec.type;
          puVar3 = src;
          uVar8 = (long)end - (long)src;
          sVar9 = uVar8 - psVar7->tag_size;
          if (psVar7->tag_size <= uVar8) {
            local_88 = sVar9;
            build_tls12_aad(local_55,rec.type,(tls->traffic_protection).dec.seq,(uint16_t)sVar9);
            iVar6 = ptls_buffer_reserve(decryptbuf,local_88);
            if (((iVar6 == 0) &&
                (psVar2 = (tls->traffic_protection).dec.aead,
                sVar9 = (*psVar2->do_decrypt)
                                  (psVar2,decryptbuf->base + decryptbuf->off,puVar3,uVar8,nonce,
                                   local_55,0xd), sVar9 == local_88)) &&
               (puVar1 = &(tls->traffic_protection).dec.seq, *puVar1 = *puVar1 + 1, uVar4 == '\x17')
               ) {
              decryptbuf->off = decryptbuf->off + local_88;
            }
          }
        }
        else {
          if (sVar9 != 8) {
            __assert_fail("tls->traffic_protection.dec.aead->algo->tls12.record_iv_size == 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x174b,
                          "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)"
                         );
          }
          iVar6 = ptls_decode64(&nonce,&src,end);
          if (iVar6 == 0) {
            psVar7 = ((tls->traffic_protection).dec.aead)->algo;
            goto LAB_00112180;
          }
        }
        ptls_buffer_dispose(local_68);
        (*ptls_clear_memory)(local_55,0xd);
        sVar9 = local_60;
      }
    }
    _input = (void *)((long)_input + consumed);
    if (iVar5 == 0x202) {
      iVar5 = 0;
    }
  } while( true );
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *const end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);

    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        if (tls->traffic_protection.dec.tls12) {
            ret = handle_input_tls12(tls, decryptbuf, input, &consumed);
        } else {
            ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        }
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}